

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

MemTxResult
access_with_adjusted_size
          (uc_struct_conflict15 *uc,hwaddr addr,uint64_t *value,uint size,uint access_size_min,
          uint access_size_max,
          _func_MemTxResult_uc_struct_ptr_MemoryRegion_ptr_hwaddr_uint64_t_ptr_uint_int_uint64_t_MemTxAttrs_conflict14
          *access_fn,MemoryRegion_conflict *mr,MemTxAttrs attrs)

{
  MemTxResult MVar1;
  uint uVar2;
  MemTxResult MVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = 4;
  if (access_size_max != 0) {
    uVar5 = access_size_max;
  }
  if (size <= uVar5) {
    uVar5 = size;
  }
  if (uVar5 < access_size_min) {
    uVar5 = access_size_min;
  }
  uVar5 = uVar5 + (uVar5 == 0);
  uVar4 = 0xffffffffffffffff >> (-(char)(uVar5 * 8) & 0x3fU);
  if (mr->ops->endianness == DEVICE_BIG_ENDIAN) {
    iVar6 = size * 8 + uVar5 * -8;
    MVar3 = 0;
    for (uVar2 = 0; uVar2 < size; uVar2 = uVar2 + uVar5) {
      MVar1 = (*access_fn)(uc,mr,uVar2 + addr,value,uVar5,iVar6,uVar4,attrs);
      MVar3 = MVar3 | MVar1;
      iVar6 = iVar6 + uVar5 * -8;
    }
  }
  else {
    iVar6 = 0;
    MVar3 = 0;
    for (uVar2 = 0; uVar2 < size; uVar2 = uVar2 + uVar5) {
      MVar1 = (*access_fn)(uc,mr,uVar2 + addr,value,uVar5,iVar6,uVar4,attrs);
      MVar3 = MVar3 | MVar1;
      iVar6 = iVar6 + uVar5 * 8;
    }
  }
  return MVar3;
}

Assistant:

static MemTxResult access_with_adjusted_size(struct uc_struct *uc, hwaddr addr,
                                      uint64_t *value,
                                      unsigned size,
                                      unsigned access_size_min,
                                      unsigned access_size_max,
                                      MemTxResult (*access_fn)
                                                  (struct uc_struct *uc,
                                                   MemoryRegion *mr,
                                                   hwaddr addr,
                                                   uint64_t *value,
                                                   unsigned size,
                                                   signed shift,
                                                   uint64_t mask,
                                                   MemTxAttrs attrs),
                                      MemoryRegion *mr,
                                      MemTxAttrs attrs)
{
    uint64_t access_mask;
    unsigned access_size;
    unsigned i;
    MemTxResult r = MEMTX_OK;

    if (!access_size_min) {
        access_size_min = 1;
    }
    if (!access_size_max) {
        access_size_max = 4;
    }

    /* FIXME: support unaligned access? */
    access_size = MAX(MIN(size, access_size_max), access_size_min);
    access_mask = MAKE_64BIT_MASK(0, access_size * 8);
    if (memory_region_big_endian(mr)) {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size,
                        (size - access_size - i) * 8, access_mask, attrs);
        }
    } else {
        for (i = 0; i < size; i += access_size) {
            r |= access_fn(uc, mr, addr + i, value, access_size, i * 8,
                        access_mask, attrs);
        }
    }
    return r;
}